

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O3

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,int n,int *i,
     number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  long lVar12;
  cpp_dec_float<100U,_int,_void> local_88;
  
  if (0 < n) {
    pNVar11 = this->m_elem + this->memused;
    lVar12 = 0;
    iVar10 = 0;
    do {
      if ((v->m_backend).fpclass == cpp_dec_float_NaN) {
LAB_003b1c95:
        pNVar11->idx = i[lVar12];
        uVar1 = *(undefined8 *)((v->m_backend).data._M_elems + 2);
        uVar2 = *(undefined8 *)((v->m_backend).data._M_elems + 4);
        uVar3 = *(undefined8 *)((v->m_backend).data._M_elems + 6);
        uVar4 = *(undefined8 *)((v->m_backend).data._M_elems + 8);
        uVar5 = *(undefined8 *)((v->m_backend).data._M_elems + 10);
        uVar6 = *(undefined8 *)((v->m_backend).data._M_elems + 0xc);
        uVar7 = *(undefined8 *)((v->m_backend).data._M_elems + 0xe);
        *(undefined8 *)(pNVar11->val).m_backend.data._M_elems =
             *(undefined8 *)(v->m_backend).data._M_elems;
        *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 2) = uVar1;
        *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 4) = uVar2;
        *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 6) = uVar3;
        *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 8) = uVar4;
        *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 10) = uVar5;
        *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 0xc) = uVar6;
        *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 0xe) = uVar7;
        (pNVar11->val).m_backend.exp = (v->m_backend).exp;
        (pNVar11->val).m_backend.neg = (v->m_backend).neg;
        iVar8 = (v->m_backend).prec_elem;
        (pNVar11->val).m_backend.fpclass = (v->m_backend).fpclass;
        (pNVar11->val).m_backend.prec_elem = iVar8;
        pNVar11 = pNVar11 + 1;
        iVar10 = iVar10 + 1;
      }
      else {
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_88,0.0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&v->m_backend,&local_88);
        if (iVar9 != 0) goto LAB_003b1c95;
      }
      v = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)(&v->m_backend + 1);
      lVar12 = lVar12 + 1;
    } while (n != (int)lVar12);
    this->memused = this->memused + iVar10;
  }
  return;
}

Assistant:

void add(int n, const int i[], const R v[])
   {
      assert(n + size() <= max());

      if(n <= 0)
         return;

      int newnnz = 0;

      Nonzero<R>* e = m_elem + size();

      while(n--)
      {
         if(*v != 0.0)
         {
            assert(e != nullptr);
            e->idx = *i;
            e->val = *v;
            e++;
            ++newnnz;
         }

         i++;
         v++;
      }

      set_size(size() + newnnz);
   }